

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

char * alloc_string(char *in)

{
  size_t __n;
  char *__dest;
  size_t sVar1;
  char *orig;
  
  __n = 0xffffffffffffffff;
  do {
    sVar1 = __n;
    __n = sVar1 + 1;
  } while (in[sVar1 + 1] != '\0');
  __dest = (char *)malloc(sVar1 + 2);
  if (__dest != (char *)0x0) {
    if (__n != 0) {
      memcpy(__dest,in,__n);
    }
    __dest[__n] = '\0';
  }
  return __dest;
}

Assistant:

static char* alloc_string(const char* in) {
  return alloc_string_sized(in, lodepng_strlen(in));
}